

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_model_based_conversion.cc
# Opt level: O2

void __thiscall
sptk::GaussianMixtureModelBasedConversion::GaussianMixtureModelBasedConversion
          (GaussianMixtureModelBasedConversion *this,int num_source_order,int num_target_order,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *window_coefficients,vector<double,_std::allocator<double>_> *weights,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          ,bool use_magic_number,double magic_number)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  uint uVar1;
  pointer pvVar2;
  void *__src;
  long lVar3;
  pointer pvVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  uint uVar10;
  int l;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int m_1;
  long lVar17;
  int l_1;
  int m;
  int iVar18;
  double dVar19;
  double local_108;
  Row local_f0;
  vector<double,_std::allocator<double>_> *local_d8;
  int local_cc;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_c8;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *local_c0;
  vector<sptk::Matrix,_std::allocator<sptk::Matrix>_> *local_b8;
  int local_ac;
  SymmetricMatrix xx;
  Row local_68;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_50;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *local_48;
  GaussianMixtureModelBasedConversion *local_40;
  long local_38;
  
  this->_vptr_GaussianMixtureModelBasedConversion =
       (_func_int **)&PTR__GaussianMixtureModelBasedConversion_0011ea00;
  this->num_source_order_ = num_source_order;
  this->num_target_order_ = num_target_order;
  iVar6 = (int)(((long)(window_coefficients->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(window_coefficients->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x18) + 1;
  this->source_length_ = (num_source_order + 1) * iVar6;
  this->target_length_ = (num_target_order + 1) * iVar6;
  local_c8 = mean_vectors;
  std::vector<double,_std::allocator<double>_>::vector(&this->weights_,weights);
  this->use_magic_number_ = use_magic_number;
  this->magic_number_ = magic_number;
  this->num_mixture_ =
       (int)((ulong)((long)(this->weights_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->weights_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3);
  NonrecursiveMaximumLikelihoodParameterGeneration::NonrecursiveMaximumLikelihoodParameterGeneration
            (&this->mlpg_,this->num_target_order_,window_coefficients,use_magic_number,magic_number)
  ;
  this->is_valid_ = true;
  iVar6 = this->num_mixture_;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&xx,(long)this->source_length_,
             (allocator_type *)&local_f0);
  this_00 = &this->source_mean_vectors_;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(this_00,(long)iVar6,(value_type *)&xx,(allocator_type *)&local_68);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&xx);
  iVar6 = this->num_mixture_;
  SymmetricMatrix::SymmetricMatrix(&xx,this->source_length_);
  local_c0 = &this->source_covariance_matrices_;
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
            (local_c0,(long)iVar6,&xx,(allocator_type *)&local_f0);
  SymmetricMatrix::~SymmetricMatrix(&xx);
  iVar6 = this->num_mixture_;
  Matrix::Matrix((Matrix *)&xx,this->target_length_,this->source_length_);
  local_b8 = &this->e_slope_;
  std::vector<sptk::Matrix,_std::allocator<sptk::Matrix>_>::vector
            (local_b8,(long)iVar6,(value_type *)&xx,(allocator_type *)&local_f0);
  Matrix::~Matrix((Matrix *)&xx);
  iVar6 = this->num_mixture_;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&xx,(long)this->target_length_,
             (allocator_type *)&local_f0);
  local_50 = &this->e_bias_;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(local_50,(long)iVar6,(value_type *)&xx,(allocator_type *)&local_68);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&xx);
  iVar6 = this->num_mixture_;
  SymmetricMatrix::SymmetricMatrix(&xx,this->target_length_);
  local_48 = &this->d_;
  local_d8 = &this->weights_;
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
            (local_48,(long)iVar6,&xx,(allocator_type *)&local_f0);
  SymmetricMatrix::~SymmetricMatrix(&xx);
  if ((((this->num_source_order_ < 0) || (this->num_target_order_ < 0)) || (this->num_mixture_ < 1))
     || ((this->mlpg_).is_valid_ != true)) {
LAB_00106a39:
    this->is_valid_ = false;
  }
  else {
    lVar13 = 0;
    local_40 = this;
    do {
      if (this->num_mixture_ <= lVar13) {
        return;
      }
      iVar6 = this->source_length_;
      lVar7 = (long)this->target_length_ + (long)iVar6;
      pvVar2 = (local_c8->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      __src = pvVar2[lVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
      if (((long)*(pointer *)
                  ((long)&pvVar2[lVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data + 8) - (long)__src >> 3 != lVar7) ||
         ((covariance_matrices->
          super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>)._M_impl
          .super__Vector_impl_data._M_start[lVar13].num_dimension_ != (int)lVar7))
      goto LAB_00106a39;
      local_38 = lVar13;
      if (iVar6 != 0) {
        memmove((this_00->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[lVar13].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start,__src,(long)iVar6 << 3);
      }
      iVar6 = 1;
      for (iVar11 = 0; iVar11 < this->source_length_; iVar11 = iVar11 + 1) {
        for (iVar18 = 0; iVar6 != iVar18; iVar18 = iVar18 + 1) {
          xx._8_8_ = (covariance_matrices->
                     super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                     )._M_impl.super__Vector_impl_data._M_start + lVar13;
          xx._vptr_SymmetricMatrix = (_func_int **)&PTR__Row_0011eac0;
          xx.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = iVar11;
          pdVar8 = SymmetricMatrix::Row::operator[]((Row *)&xx,iVar18);
          dVar19 = *pdVar8;
          local_f0.matrix_ =
               (local_c0->
               super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>).
               _M_impl.super__Vector_impl_data._M_start + lVar13;
          local_f0._vptr_Row = (_func_int **)&PTR__Row_0011eac0;
          local_f0.row_ = iVar11;
          pdVar8 = SymmetricMatrix::Row::operator[](&local_f0,iVar18);
          *pdVar8 = dVar19;
          this = local_40;
        }
        iVar6 = iVar6 + 1;
      }
      SymmetricMatrix::SymmetricMatrix(&xx,this->source_length_);
      bVar5 = SymmetricMatrix::Invert
                        ((local_c0->
                         super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar13,&xx);
      if (bVar5) {
        lVar7 = 0;
        while( true ) {
          uVar1 = this->target_length_;
          uVar9 = (ulong)(int)uVar1;
          uVar10 = this->source_length_;
          if ((long)uVar9 <= lVar7) break;
          iVar6 = uVar10 + (int)lVar7;
          for (lVar17 = 0; lVar17 < (int)uVar10; lVar17 = lVar17 + 1) {
            for (iVar11 = 0; iVar11 < (int)uVar10; iVar11 = iVar11 + 1) {
              local_f0.matrix_ =
                   (covariance_matrices->
                   super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar13;
              local_f0._vptr_Row = (_func_int **)&PTR__Row_0011eac0;
              local_f0.row_ = iVar6;
              pdVar8 = SymmetricMatrix::Row::operator[](&local_f0,iVar11);
              dVar19 = *pdVar8;
              local_68._vptr_Row = (_func_int **)&PTR__Row_0011eac0;
              local_68.matrix_ = &xx;
              local_68.row_ = iVar11;
              pdVar8 = SymmetricMatrix::Row::operator[](&local_68,(int)lVar17);
              lVar3 = *(long *)(*(long *)&(local_40->e_slope_).
                                          super__Vector_base<sptk::Matrix,_std::allocator<sptk::Matrix>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar13].index_.
                                          super__Vector_base<double_*,_std::allocator<double_*>_>.
                                          _M_impl + lVar7 * 8);
              *(double *)(lVar3 + lVar17 * 8) = dVar19 * *pdVar8 + *(double *)(lVar3 + lVar17 * 8);
              uVar10 = local_40->source_length_;
              this = local_40;
            }
          }
          lVar7 = lVar7 + 1;
        }
        pvVar2 = (local_c8->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = (local_50->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar14 = 0;
        if (0 < (int)uVar10) {
          uVar14 = (ulong)uVar10;
        }
        uVar15 = 0;
        if (0 < (int)uVar1) {
          uVar15 = (ulong)uVar1;
        }
        for (uVar16 = 0; uVar16 != uVar15; uVar16 = uVar16 + 1) {
          dVar19 = 0.0;
          for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
            dVar19 = dVar19 + *(double *)
                               (*(long *)(*(long *)&(local_b8->
                                                                                                        
                                                  super__Vector_base<sptk::Matrix,_std::allocator<sptk::Matrix>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[lVar13]
                                                  .index_.
                                                  super__Vector_base<double_*,_std::allocator<double_*>_>
                                                  ._M_impl.super__Vector_impl_data + uVar16 * 8) +
                               uVar12 * 8) *
                              *(double *)
                               (*(long *)&(local_c8->
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start[lVar13].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data + uVar12 * 8);
          }
          *(double *)
           (*(long *)&pvVar4[lVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + uVar16 * 8) =
               *(double *)
                (uVar16 * 8 +
                 *(long *)&pvVar2[lVar13].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data + (long)(int)uVar10 * 8) - dVar19;
        }
        local_cc = 1;
        for (lVar7 = 0; lVar7 < (int)uVar9; lVar7 = lVar7 + 1) {
          local_ac = this->source_length_ + (int)lVar7;
          for (iVar6 = 0; iVar6 != local_cc; iVar6 = iVar6 + 1) {
            iVar11 = this->source_length_;
            iVar18 = iVar11 + iVar6;
            local_108 = 0.0;
            for (lVar17 = 0; lVar17 < iVar11; lVar17 = lVar17 + 1) {
              dVar19 = *(double *)
                        (*(long *)(*(long *)&(local_b8->
                                             super__Vector_base<sptk::Matrix,_std::allocator<sptk::Matrix>_>
                                             )._M_impl.super__Vector_impl_data._M_start[lVar13].
                                             index_.
                                             super__Vector_base<double_*,_std::allocator<double_*>_>
                                             ._M_impl + lVar7 * 8) + lVar17 * 8);
              local_f0.matrix_ =
                   (covariance_matrices->
                   super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar13;
              local_f0._vptr_Row = (_func_int **)&PTR__Row_0011eac0;
              local_f0.row_ = (int)lVar17;
              pdVar8 = SymmetricMatrix::Row::operator[](&local_f0,iVar18);
              local_108 = local_108 + dVar19 * *pdVar8;
              iVar11 = this->source_length_;
            }
            local_f0.matrix_ =
                 (covariance_matrices->
                 super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>).
                 _M_impl.super__Vector_impl_data._M_start + lVar13;
            local_f0._vptr_Row = (_func_int **)&PTR__Row_0011eac0;
            local_f0.row_ = local_ac;
            pdVar8 = SymmetricMatrix::Row::operator[](&local_f0,iVar18);
            dVar19 = *pdVar8;
            local_68.matrix_ =
                 (local_48->
                 super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>).
                 _M_impl.super__Vector_impl_data._M_start + lVar13;
            local_68._vptr_Row = (_func_int **)&PTR__Row_0011eac0;
            local_68.row_ = (int)lVar7;
            pdVar8 = SymmetricMatrix::Row::operator[](&local_68,iVar6);
            *pdVar8 = dVar19 - local_108;
          }
          local_cc = local_cc + 1;
          uVar9 = (ulong)(uint)this->target_length_;
        }
      }
      else {
        this->is_valid_ = false;
      }
      SymmetricMatrix::~SymmetricMatrix(&xx);
      lVar13 = local_38 + 1;
    } while (bVar5);
  }
  return;
}

Assistant:

GaussianMixtureModelBasedConversion::GaussianMixtureModelBasedConversion(
    int num_source_order, int num_target_order,
    const std::vector<std::vector<double> >& window_coefficients,
    const std::vector<double>& weights,
    const std::vector<std::vector<double> >& mean_vectors,
    const std::vector<SymmetricMatrix>& covariance_matrices,
    bool use_magic_number, double magic_number)
    : num_source_order_(num_source_order),
      num_target_order_(num_target_order),
      source_length_((num_source_order_ + 1) *
                     (static_cast<int>(window_coefficients.size() + 1))),
      target_length_((num_target_order_ + 1) *
                     (static_cast<int>(window_coefficients.size() + 1))),
      weights_(weights),
      use_magic_number_(use_magic_number),
      magic_number_(magic_number),
      num_mixture_(static_cast<int>(weights_.size())),
      mlpg_(num_target_order_, window_coefficients, use_magic_number_,
            magic_number_),
      is_valid_(true),
      source_mean_vectors_(num_mixture_, std::vector<double>(source_length_)),
      source_covariance_matrices_(num_mixture_,
                                  SymmetricMatrix(source_length_)),
      e_slope_(num_mixture_, Matrix(target_length_, source_length_)),
      e_bias_(num_mixture_, std::vector<double>(target_length_)),
      d_(num_mixture_, SymmetricMatrix(target_length_)) {
  if (num_source_order_ < 0 || num_target_order_ < 0 || num_mixture_ <= 0 ||
      !mlpg_.IsValid()) {
    is_valid_ = false;
    return;
  }

  for (int k(0); k < num_mixture_; ++k) {
    // Check size of mean vectors and covariance matrices.
    const int total_length(source_length_ + target_length_);
    if (mean_vectors[k].size() != static_cast<std::size_t>(total_length) ||
        covariance_matrices[k].GetNumDimension() != total_length) {
      is_valid_ = false;
      return;
    }

    // Set \mu^{(X)}.
    std::copy(mean_vectors[k].begin(), mean_vectors[k].begin() + source_length_,
              source_mean_vectors_[k].begin());

    // Set \Sigma^{(XX)}.
    for (int l(0); l < source_length_; ++l) {
      for (int m(0); m <= l; ++m) {
        source_covariance_matrices_[k][l][m] = covariance_matrices[k][l][m];
      }
    }

    // Set \Sigma^{(YX)} \Sigma^{(XX)}^{-1}.
    SymmetricMatrix xx(source_length_);
    if (!source_covariance_matrices_[k].Invert(&xx)) {
      is_valid_ = false;
      return;
    }
    for (int l(0); l < target_length_; ++l) {
      const int ll(source_length_ + l);
      for (int m(0); m < source_length_; ++m) {
        for (int n(0); n < source_length_; ++n) {
          e_slope_[k][l][m] += covariance_matrices[k][ll][n] * xx[n][m];
        }
      }
    }

    // Set \mu^{(Y)} - \Sigma^{(YX)} \Sigma^{(XX)}^{-1} \mu^{(X)}
    for (int l(0); l < target_length_; ++l) {
      const int ll(l + source_length_);
      double tmp(0.0);
      for (int m(0); m < source_length_; ++m) {
        tmp += e_slope_[k][l][m] * mean_vectors[k][m];
      }
      e_bias_[k][l] = mean_vectors[k][ll] - tmp;
    }

    // Set D^{(Y)}.
    for (int l(0); l < target_length_; ++l) {
      const int ll(source_length_ + l);
      for (int m(0); m <= l; ++m) {
        const int mm(source_length_ + m);
        double tmp(0.0);
        for (int n(0); n < source_length_; ++n) {
          tmp += e_slope_[k][l][n] * covariance_matrices[k][n][mm];
        }
        d_[k][l][m] = covariance_matrices[k][ll][mm] - tmp;
      }
    }
  }
}